

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__tga_info(stbi__context *s,int *x,int *y,int *comp)

{
  byte bVar1;
  stbi_uc sVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int sz;
  int tga_comp;
  int tga_h;
  int tga_w;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  stbi__get8(s);
  bVar1 = stbi__get8(s);
  if (bVar1 < 2) {
    sVar2 = stbi__get8(s);
    if (((((sVar2 == '\x01') || (sVar2 == '\x02')) || (sVar2 == '\x03')) ||
        ((sVar2 == '\t' || (sVar2 == '\n')))) || (sVar2 == '\v')) {
      stbi__skip(s,9);
      iVar3 = stbi__get16le(s);
      if (iVar3 < 1) {
        stbi__rewind(s);
        s_local._4_4_ = 0;
      }
      else {
        iVar4 = stbi__get16le(s);
        if (iVar4 < 1) {
          stbi__rewind(s);
          s_local._4_4_ = 0;
        }
        else {
          bVar1 = stbi__get8(s);
          uVar5 = (uint)bVar1;
          if (((uVar5 == 8) || (uVar5 == 0x10)) || ((uVar5 == 0x18 || (uVar5 == 0x20)))) {
            if (x != (int *)0x0) {
              *x = iVar3;
            }
            if (y != (int *)0x0) {
              *y = iVar4;
            }
            if (comp != (int *)0x0) {
              *comp = uVar5 / 8;
            }
            s_local._4_4_ = 1;
          }
          else {
            stbi__rewind(s);
            s_local._4_4_ = 0;
          }
        }
      }
    }
    else {
      s_local._4_4_ = 0;
    }
  }
  else {
    stbi__rewind(s);
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

static int stbi__tga_info(stbi__context *s, int *x, int *y, int *comp)
{
    int tga_w, tga_h, tga_comp;
    int sz;
    stbi__get8(s);                   // discard Offset
    sz = stbi__get8(s);              // color type
    if( sz > 1 ) {
        stbi__rewind(s);
        return 0;      // only RGB or indexed allowed
    }
    sz = stbi__get8(s);              // image type
    // only RGB or grey allowed, +/- RLE
    if ((sz != 1) && (sz != 2) && (sz != 3) && (sz != 9) && (sz != 10) && (sz != 11)) return 0;
    stbi__skip(s,9);
    tga_w = stbi__get16le(s);
    if( tga_w < 1 ) {
        stbi__rewind(s);
        return 0;   // test width
    }
    tga_h = stbi__get16le(s);
    if( tga_h < 1 ) {
        stbi__rewind(s);
        return 0;   // test height
    }
    sz = stbi__get8(s);               // bits per pixel
    // only RGB or RGBA or grey allowed
    if ((sz != 8) && (sz != 16) && (sz != 24) && (sz != 32)) {
        stbi__rewind(s);
        return 0;
    }
    tga_comp = sz;
    if (x) *x = tga_w;
    if (y) *y = tga_h;
    if (comp) *comp = tga_comp / 8;
    return 1;                   // seems to have passed everything
}